

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChStream.cpp
# Opt level: O3

ChStreamOutBinary * __thiscall
chrono::ChStreamOutBinary::operator<<(ChStreamOutBinary *this,float Val)

{
  undefined1 uVar1;
  bool bVar2;
  _func_int **pp_Var3;
  undefined1 *puVar4;
  bool bVar5;
  undefined4 *puVar6;
  float *pfVar7;
  float tmp;
  undefined1 local_10 [3];
  undefined1 uStack_d;
  float local_c;
  
  if ((this->super_ChBinaryArchive).big_endian_machine == true) {
    puVar4 = (undefined1 *)((long)local_10 + 3);
    _local_10 = Val;
    puVar6 = (undefined4 *)local_10;
    bVar2 = true;
    do {
      bVar5 = bVar2;
      uVar1 = *(undefined1 *)puVar6;
      *(undefined1 *)puVar6 = *puVar4;
      *puVar4 = uVar1;
      puVar4 = puVar4 + -1;
      puVar6 = (undefined4 *)((long)local_10 + 1);
      bVar2 = false;
    } while (bVar5);
    pp_Var3 = (this->super_ChStreamOut)._vptr_ChStreamOut;
    pfVar7 = (float *)local_10;
  }
  else {
    pp_Var3 = (this->super_ChStreamOut)._vptr_ChStreamOut;
    pfVar7 = &local_c;
  }
  local_c = Val;
  (*pp_Var3[2])(this,pfVar7,4);
  return this;
}

Assistant:

ChStreamOutBinary& ChStreamOutBinary::operator<<(const float Val) {
    if (big_endian_machine) {
        float tmp = Val;
        StreamSwapBytes<float>(&tmp);
        this->Output((char*)&tmp, sizeof(float));
    } else {
        this->Output((char*)&Val, sizeof(float));
    }
    return (*this);
}